

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void FilterLoop26_C(uint8_t *p,int hstride,int vstride,int size,int thresh,int ithresh,
                   int hev_thresh)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  for (; 0 < size; size = size + -1) {
    iVar6 = NeedsFilter2_C(p,hstride,thresh * 2 + 1,ithresh);
    if (iVar6 != 0) {
      iVar6 = Hev(p,hstride,hev_thresh);
      if (iVar6 == 0) {
        bVar1 = p[hstride * -2];
        bVar2 = p[-hstride];
        bVar3 = *p;
        bVar4 = p[hstride];
        iVar6 = (int)(char)sclip1[(long)(char)sclip1[((ulong)bVar1 - (ulong)bVar4) + 0x3fc] +
                                  ((ulong)bVar3 - (ulong)bVar2) * 3 + 0x3fc];
        lVar8 = (long)(iVar6 * 0x1b + 0x3f >> 7);
        lVar9 = (long)(iVar6 * 0x12 + 0x3f >> 7);
        bVar5 = p[hstride * 2];
        lVar7 = (long)(iVar6 * 9 + 0x3f >> 7);
        p[hstride * -3] = ""[(ulong)p[hstride * -3] + lVar7 + 0xff];
        p[hstride * -2] = ""[(ulong)bVar1 + lVar9 + 0xff];
        p[-hstride] = ""[(ulong)bVar2 + lVar8 + 0xff];
        *p = ""[((ulong)bVar3 - lVar8) + 0xff];
        p[hstride] = ""[((ulong)bVar4 - lVar9) + 0xff];
        p[hstride * 2] = ""[((ulong)bVar5 - lVar7) + 0xff];
      }
      else {
        DoFilter2_C(p,hstride);
      }
    }
    p = p + vstride;
  }
  return;
}

Assistant:

static WEBP_INLINE void FilterLoop26_C(uint8_t* p,
                                       int hstride, int vstride, int size,
                                       int thresh, int ithresh,
                                       int hev_thresh) {
  const int thresh2 = 2 * thresh + 1;
  while (size-- > 0) {
    if (NeedsFilter2_C(p, hstride, thresh2, ithresh)) {
      if (Hev(p, hstride, hev_thresh)) {
        DoFilter2_C(p, hstride);
      } else {
        DoFilter6_C(p, hstride);
      }
    }
    p += vstride;
  }
}